

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMeshDecimator.cpp
# Opt level: O1

void __thiscall
HACD::MeshDecimator::GetMeshData(MeshDecimator *this,Vec3<double> *points,Vec3<long> *triangles)

{
  void *pvVar1;
  double *pdVar2;
  long *plVar3;
  bool *pbVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = this->m_nPoints;
  pvVar1 = operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
  if (uVar6 != 0) {
    pdVar2 = this->m_points->m_data + 2;
    pbVar4 = &((this->m_vertices).
               super__Vector_base<HACD::MDVertex,_std::allocator<HACD::MDVertex>_>._M_impl.
               super__Vector_impl_data._M_start)->m_tag;
    uVar5 = 0;
    lVar7 = 0;
    do {
      if (*pbVar4 == true) {
        points[lVar7].m_data[0] = ((Vec3<double> *)(pdVar2 + -2))->m_data[0];
        points[lVar7].m_data[1] = pdVar2[-1];
        points[lVar7].m_data[2] = *pdVar2;
        *(long *)((long)pvVar1 + uVar5 * 8) = lVar7;
        lVar7 = lVar7 + 1;
      }
      uVar5 = uVar5 + 1;
      pdVar2 = pdVar2 + 3;
      pbVar4 = pbVar4 + 0x188;
    } while (uVar6 != uVar5);
  }
  if (this->m_nInitialTriangles != 0) {
    pbVar4 = this->m_trianglesTags;
    plVar3 = this->m_triangles->m_data + 2;
    uVar6 = 0;
    lVar7 = 0;
    do {
      if (pbVar4[uVar6] == true) {
        triangles[lVar7].m_data[0] =
             *(long *)((long)pvVar1 + ((Vec3<long> *)(plVar3 + -2))->m_data[0] * 8);
        triangles[lVar7].m_data[1] = *(long *)((long)pvVar1 + plVar3[-1] * 8);
        triangles[lVar7].m_data[2] = *(long *)((long)pvVar1 + *plVar3 * 8);
        lVar7 = lVar7 + 1;
      }
      uVar6 = uVar6 + 1;
      plVar3 = plVar3 + 3;
    } while (uVar6 < this->m_nInitialTriangles);
  }
  operator_delete__(pvVar1);
  return;
}

Assistant:

void MeshDecimator::GetMeshData(Vec3<Float> * points, Vec3<long> * triangles) const
	{
		long * map = new long [m_nPoints];
		long counter = 0;
		for (size_t v = 0; v < m_nPoints; ++v)
		{
			if ( m_vertices[v].m_tag )
			{
				points[counter] = m_points[v];
				map[v] = counter++;
			}
		}
		counter = 0;
		for (size_t t = 0; t < m_nInitialTriangles; ++t)
		{
			if ( m_trianglesTags[t] )
			{
				triangles[counter].X() = map[m_triangles[t].X()];
				triangles[counter].Y() = map[m_triangles[t].Y()];
				triangles[counter].Z() = map[m_triangles[t].Z()];
				counter++;
			}
		}
		delete [] map;
	}